

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::ElabSystemTaskSymbol::issueDiagnostic(ElabSystemTaskSymbol *this)

{
  ElabSystemTaskSymbol *this_00;
  uint uVar1;
  Diagnostic *this_01;
  uint uVar2;
  Expression *in_R9;
  string_view message;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> msg;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_50;
  char local_40;
  string local_38;
  
  this_00 = (ElabSystemTaskSymbol *)(this->super_Symbol).parentScope;
  getMessage((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_50._M_value,
             this);
  if (local_40 != '\x01') {
    return;
  }
  switch(this->taskKind) {
  case Fatal:
    uVar1 = 0x3c0000;
    break;
  case Error:
    uVar1 = 0x350000;
    break;
  case Warning:
    uVar1 = 0x1000000;
    break;
  case Info:
    uVar1 = 0xe40000;
    break;
  case StaticAssert:
    message._M_str = (char *)this->assertCondition;
    message._M_len = (size_t)local_50._M_value._M_str;
    reportStaticAssert(this_00,(Scope *)(this->super_Symbol).location,
                       (SourceLocation)local_50._M_value._M_len,message,in_R9);
    return;
  default:
    uVar2 = 0;
    uVar1 = 0;
    goto LAB_0021333b;
  }
  uVar2 = 6;
LAB_0021333b:
  this_01 = Scope::addDiag((Scope *)this_00,(DiagCode)(uVar2 | uVar1),(this->super_Symbol).location)
  ;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,local_50._M_value._M_str,
             local_50._M_value._M_str + local_50._M_value._M_len);
  Diagnostic::addStringAllowEmpty(this_01,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::issueDiagnostic() const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto msg = getMessage();
    if (!msg)
        return;

    DiagCode code;
    switch (taskKind) {
        case ElabSystemTaskKind::Fatal:
            code = diag::FatalTask;
            break;
        case ElabSystemTaskKind::Error:
            code = diag::ErrorTask;
            break;
        case ElabSystemTaskKind::Warning:
            code = diag::WarningTask;
            break;
        case ElabSystemTaskKind::Info:
            code = diag::InfoTask;
            break;
        case ElabSystemTaskKind::StaticAssert:
            reportStaticAssert(*scope, location, *msg, assertCondition);
            return;
    }

    scope->addDiag(code, location).addStringAllowEmpty(std::string(*msg));
}